

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O2

void WebPRescalerImportRowExpand_C(WebPRescaler *wrk,uint8_t *src)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  rescaler_t *prVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar10;
  
  uVar2 = wrk->num_channels;
  lVar5 = (long)(int)uVar2;
  iVar3 = wrk->dst_width;
  uVar6 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
LAB_0011142a:
  if (uVar6 == uVar8) {
    return;
  }
  bVar1 = src[uVar6];
  uVar9 = (uint)bVar1;
  uVar10 = uVar6 + lVar5;
  if (1 < wrk->src_width) {
    bVar1 = src[uVar10];
  }
  iVar13 = wrk->x_add;
  prVar4 = wrk->frow;
  uVar12 = uVar6;
  iVar7 = iVar13;
  do {
    uVar11 = (uint)bVar1;
    do {
      prVar4[uVar12] = (uVar9 - uVar11) * iVar7 + iVar13 * uVar11;
      uVar12 = uVar12 + lVar5;
      if (iVar3 * lVar5 <= (long)uVar12) {
        uVar6 = uVar6 + 1;
        goto LAB_0011142a;
      }
      iVar7 = iVar7 - wrk->x_sub;
      iVar13 = wrk->x_add;
    } while (-1 < iVar7);
    uVar9 = (int)uVar10 + uVar2;
    uVar10 = (ulong)uVar9;
    bVar1 = src[(int)uVar9];
    iVar7 = iVar7 + iVar13;
    uVar9 = uVar11;
  } while( true );
}

Assistant:

void WebPRescalerImportRowExpand_C(WebPRescaler* const wrk,
                                   const uint8_t* src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    // simple bilinear interpolation
    int accum = wrk->x_add;
    rescaler_t left = (rescaler_t)src[x_in];
    rescaler_t right =
        (wrk->src_width > 1) ? (rescaler_t)src[x_in + x_stride] : left;
    x_in += x_stride;
    while (1) {
      wrk->frow[x_out] = right * wrk->x_add + (left - right) * accum;
      x_out += x_stride;
      if (x_out >= x_out_max) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        left = right;
        x_in += x_stride;
        assert(x_in < wrk->src_width * x_stride);
        right = (rescaler_t)src[x_in];
        accum += wrk->x_add;
      }
    }
    assert(wrk->x_sub == 0 /* <- special case for src_width=1 */ || accum == 0);
  }
}